

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-strtod.cpp
# Opt level: O0

float __thiscall
icu_63::double_conversion::Strtof(double_conversion *this,Vector<const_char> buffer,int exponent)

{
  uint32_t uVar1;
  DiyFp DVar2;
  Vector<const_char> buffer_00;
  Vector<const_char> trimmed_00;
  Vector<const_char> buffer_01;
  int *in_stack_fffffffffffffb80;
  Single local_464;
  uint64_t local_460;
  int local_458;
  undefined8 local_450;
  undefined4 local_448;
  undefined4 uStack_444;
  int local_43c;
  uint64_t uStack_438;
  int comparison;
  int local_430;
  Single local_424;
  uint64_t local_420;
  int local_418;
  uint64_t local_410;
  int local_408;
  Double local_400;
  uint64_t local_3f8;
  int local_3f0;
  undefined4 local_3e4;
  undefined1 auStack_3e0 [4];
  float min_float;
  DiyFp upper_boundary;
  float next;
  float guess;
  double local_3c0;
  double double_next2;
  float f4;
  float f3;
  float f2;
  float f1;
  double local_3a0;
  double double_previous;
  double local_390;
  double double_next;
  undefined8 uStack_380;
  float float_guess;
  undefined4 local_378;
  undefined4 uStack_374;
  byte local_369;
  double dStack_368;
  bool is_correct;
  double double_guess;
  undefined8 local_358;
  undefined1 local_34c [8];
  int updated_exponent;
  Vector<const_char> trimmed;
  char copy_buffer [780];
  int exponent_local;
  Vector<const_char> buffer_local;
  
  buffer_00.length_ = buffer.length_;
  Vector<const_char>::Vector((Vector<const_char> *)(local_34c + 4));
  local_358 = CONCAT44(buffer_local.start_._4_4_,(uint)buffer.start_);
  buffer_00.start_ = (char *)(ulong)(uint)buffer.start_;
  buffer_00._12_4_ = 0;
  double_guess = (double)this;
  TrimAndCut(this,buffer_00,(int)&trimmed + 8,(char *)0x30c,(int)local_34c + 4,
             (Vector<const_char> *)local_34c,in_stack_fffffffffffffb80);
  uStack_380 = stack0xfffffffffffffcb8;
  local_378 = SUB84(trimmed.start_,0);
  uStack_374 = (undefined4)((ulong)trimmed.start_ >> 0x20);
  trimmed_00.length_ = local_378;
  trimmed_00.start_ = (char *)stack0xfffffffffffffcb8;
  trimmed_00._12_4_ = 0;
  local_369 = ComputeGuess(trimmed_00,local_34c._0_4_,&stack0xfffffffffffffc98);
  double_next._4_4_ = (float)dStack_368;
  if (((double)double_next._4_4_ != dStack_368) ||
     (buffer_local._12_4_ = double_next._4_4_, NAN((double)double_next._4_4_) || NAN(dStack_368))) {
    Double::Double((Double *)&double_previous,dStack_368);
    local_390 = Double::NextDouble((Double *)&double_previous);
    Double::Double((Double *)&f2,dStack_368);
    local_3a0 = Double::PreviousDouble((Double *)&f2);
    f3 = (float)local_3a0;
    f4 = double_next._4_4_;
    double_next2._0_4_ = (float)local_390;
    double_next2._4_4_ = double_next2._0_4_;
    if ((local_369 & 1) == 0) {
      Double::Double((Double *)&next,local_390);
      local_3c0 = Double::NextDouble((Double *)&next);
      double_next2._0_4_ = (float)local_3c0;
    }
    if ((f3 != double_next2._0_4_) || (NAN(f3) || NAN(double_next2._0_4_))) {
      upper_boundary._12_4_ = f3;
      upper_boundary.e_ = (int)double_next2._0_4_;
      DiyFp::DiyFp((DiyFp *)auStack_3e0);
      if (((float)upper_boundary._12_4_ != 0.0) || (NAN((float)upper_boundary._12_4_))) {
        Single::Single(&local_424,(float)upper_boundary._12_4_);
        DVar2 = Single::UpperBoundary(&local_424);
        uStack_438 = DVar2.f_;
        local_430 = DVar2.e_;
        local_420 = uStack_438;
        local_418 = local_430;
        _auStack_3e0 = uStack_438;
        upper_boundary.f_._0_4_ = local_430;
      }
      else {
        local_3e4 = 1;
        Double::Double(&local_400,7.006492321624085e-46);
        DVar2 = Double::AsDiyFp(&local_400);
        local_410 = DVar2.f_;
        local_408 = DVar2.e_;
        local_3f8 = local_410;
        local_3f0 = local_408;
        _auStack_3e0 = local_410;
        upper_boundary.f_._0_4_ = local_408;
      }
      local_450 = stack0xfffffffffffffcb8;
      local_448 = SUB84(trimmed.start_,0);
      uStack_444 = (undefined4)((ulong)trimmed.start_ >> 0x20);
      local_460 = _auStack_3e0;
      local_458 = (int)upper_boundary.f_;
      buffer_01.length_ = local_448;
      buffer_01.start_ = (char *)stack0xfffffffffffffcb8;
      DVar2.e_ = (int)upper_boundary.f_;
      DVar2.f_ = _auStack_3e0;
      buffer_01._12_4_ = 0;
      DVar2._12_4_ = 0;
      local_43c = CompareBufferWithDiyFp(buffer_01,local_34c._0_4_,DVar2);
      if (local_43c < 0) {
        buffer_local._12_4_ = upper_boundary._12_4_;
      }
      else if (local_43c < 1) {
        Single::Single(&local_464,(float)upper_boundary._12_4_);
        uVar1 = Single::Significand(&local_464);
        if ((uVar1 & 1) == 0) {
          buffer_local._12_4_ = upper_boundary._12_4_;
        }
        else {
          buffer_local._12_4_ = upper_boundary.e_;
        }
      }
      else {
        buffer_local._12_4_ = upper_boundary.e_;
      }
    }
    else {
      buffer_local._12_4_ = double_next._4_4_;
    }
  }
  return (float)buffer_local._12_4_;
}

Assistant:

float Strtof(Vector<const char> buffer, int exponent) {
  char copy_buffer[kMaxSignificantDecimalDigits];
  Vector<const char> trimmed;
  int updated_exponent;
  TrimAndCut(buffer, exponent, copy_buffer, kMaxSignificantDecimalDigits,
             &trimmed, &updated_exponent);
  exponent = updated_exponent;

  double double_guess;
  bool is_correct = ComputeGuess(trimmed, exponent, &double_guess);

  float float_guess = static_cast<float>(double_guess);
  if (float_guess == double_guess) {
    // This shortcut triggers for integer values.
    return float_guess;
  }

  // We must catch double-rounding. Say the double has been rounded up, and is
  // now a boundary of a float, and rounds up again. This is why we have to
  // look at previous too.
  // Example (in decimal numbers):
  //    input: 12349
  //    high-precision (4 digits): 1235
  //    low-precision (3 digits):
  //       when read from input: 123
  //       when rounded from high precision: 124.
  // To do this we simply look at the neigbors of the correct result and see
  // if they would round to the same float. If the guess is not correct we have
  // to look at four values (since two different doubles could be the correct
  // double).

  double double_next = Double(double_guess).NextDouble();
  double double_previous = Double(double_guess).PreviousDouble();

  float f1 = static_cast<float>(double_previous);
  float f2 = float_guess;
  float f3 = static_cast<float>(double_next);
  float f4;
  if (is_correct) {
    f4 = f3;
  } else {
    double double_next2 = Double(double_next).NextDouble();
    f4 = static_cast<float>(double_next2);
  }
  (void) f2;  // Mark variable as used.
  ASSERT(f1 <= f2 && f2 <= f3 && f3 <= f4);

  // If the guess doesn't lie near a single-precision boundary we can simply
  // return its float-value.
  if (f1 == f4) {
    return float_guess;
  }

  ASSERT((f1 != f2 && f2 == f3 && f3 == f4) ||
         (f1 == f2 && f2 != f3 && f3 == f4) ||
         (f1 == f2 && f2 == f3 && f3 != f4));

  // guess and next are the two possible canditates (in the same way that
  // double_guess was the lower candidate for a double-precision guess).
  float guess = f1;
  float next = f4;
  DiyFp upper_boundary;
  if (guess == 0.0f) {
    float min_float = 1e-45f;
    upper_boundary = Double(static_cast<double>(min_float) / 2).AsDiyFp();
  } else {
    upper_boundary = Single(guess).UpperBoundary();
  }
  int comparison = CompareBufferWithDiyFp(trimmed, exponent, upper_boundary);
  if (comparison < 0) {
    return guess;
  } else if (comparison > 0) {
    return next;
  } else if ((Single(guess).Significand() & 1) == 0) {
    // Round towards even.
    return guess;
  } else {
    return next;
  }
}